

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QUrl,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QDebug local_18;
  QUrl *in_stack_fffffffffffffff0;
  QDebug *d;
  
  d = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(&local_18,in_RSI);
  ::operator<<(d,in_stack_fffffffffffffff0);
  QDebug::~QDebug(d);
  QDebug::~QDebug(d);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }